

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  pointer *bindings;
  _Head_base<0UL,_wabt::FuncImport_*,_false> _Var1;
  FuncImport *pFVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  long lVar6;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_120;
  FuncImport *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_f0;
  string name;
  ModuleFieldList export_fields;
  TypeVector local_types;
  string local_88 [32];
  string local_68 [32];
  Location loc;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar4 = Expect(this,Func);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar4 = ParseInlineExports(this,&export_fields,First);
  EVar5 = Error;
  if (RVar4.enum_ == Error) goto LAB_001689e8;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::FuncImport,std::__cxx11::string&>((wabt *)&local_120,&name);
    _Var1._M_head_impl = local_120._M_head_impl;
    RVar4 = ParseInlineImport(this,(Import *)local_120._M_head_impl);
    if (((RVar4.enum_ != Error) &&
        (RVar4 = ParseTypeUseOpt(this,&((_Var1._M_head_impl)->func).decl), RVar4.enum_ != Error)) &&
       (RVar4 = ParseFuncSignature(this,&((_Var1._M_head_impl)->func).decl.sig,
                                   &((_Var1._M_head_impl)->func).bindings), RVar4.enum_ != Error)) {
      std::__cxx11::string::string((string *)&local_types,"type",&local_121);
      std::__cxx11::string::string(local_88,"param",&local_122);
      std::__cxx11::string::string(local_68,"result",&local_123);
      local_118 = (FuncImport *)0x0;
      uStack_110 = 0;
      local_108 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 (string *)&local_types,&loc);
      RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_118,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_118);
      lVar6 = 0x40;
      do {
        std::__cxx11::string::_M_dispose();
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
      if (RVar4.enum_ != Error) {
        GetLocation((Location *)&local_types,this);
        MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
                  ((wabt *)&local_118,
                   (unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                   &local_120,(Location *)&local_types);
        local_f0._M_head_impl = (ImportModuleField *)local_118;
        local_118 = (FuncImport *)0x0;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_f0);
        if ((FuncImport *)local_f0._M_head_impl != (FuncImport *)0x0) {
          (*(((ImportMixin<(wabt::ExternalKind)0> *)
             &(local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>)->
            super_Import)._vptr_Import[1])();
        }
        local_f0._M_head_impl = (ImportModuleField *)0x0;
        if (local_118 != (FuncImport *)0x0) {
          (*(local_118->super_ImportMixin<(wabt::ExternalKind)0>).super_Import._vptr_Import[1])();
        }
LAB_00168ac1:
        if (local_120._M_head_impl != (FuncImport *)0x0) {
          (*((local_120._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
            _vptr_Import[1])();
        }
        anon_unknown_1::AppendInlineExportFields
                  (module,&export_fields,
                   (int)((ulong)((long)(module->funcs).
                                       super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar4 = Expect(this,Rpar);
        EVar5 = (Enum)(RVar4.enum_ == Error);
        goto LAB_001689e8;
      }
    }
  }
  else {
    MakeUnique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_118,&loc,&name);
    pFVar2 = local_118;
    RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)&(local_118->func).name.field_2);
    local_120._M_head_impl = local_118;
    if (RVar4.enum_ != Error) {
      bindings = &(pFVar2->func).local_types.decls_.
                  super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      RVar4 = ParseFuncSignature(this,(FuncSignature *)
                                      ((long)&(pFVar2->func).decl.type_var.field_2 + 0x10),
                                 (BindingHash *)bindings);
      local_120._M_head_impl = local_118;
      if (RVar4.enum_ != Error) {
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RVar4 = ParseBoundValueTypeList
                          (this,Local,&local_types,(BindingHash *)bindings,
                           (Index)((ulong)(*(long *)((long)&(pFVar2->func).decl.type_var.field_2 +
                                                    0x18) -
                                          *(long *)((long)&(pFVar2->func).decl.type_var.field_2 +
                                                   0x10)) >> 2));
        if (RVar4.enum_ != Error) {
          LocalTypes::Set((LocalTypes *)
                          &(pFVar2->func).decl.sig.result_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_types);
          RVar4 = ParseTerminatingInstrList
                            (this,(ExprList *)
                                  &(pFVar2->func).bindings.
                                   super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                   ._M_h._M_rehash_policy._M_next_resize);
          if (RVar4.enum_ != Error) {
            local_f8._M_head_impl = (FuncModuleField *)local_118;
            local_118 = (FuncImport *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                                        *)&local_f8);
            if ((FuncImport *)local_f8._M_head_impl != (FuncImport *)0x0) {
              (*(((ImportMixin<(wabt::ExternalKind)0> *)
                 &(local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>)->
                super_Import)._vptr_Import[1])();
            }
            local_f8._M_head_impl = (FuncModuleField *)0x0;
            std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                      (&local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
            local_120._M_head_impl = local_118;
            goto LAB_00168ac1;
          }
        }
        std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                  (&local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
        local_120._M_head_impl = local_118;
      }
    }
  }
  if (local_120._M_head_impl != (FuncImport *)0x0) {
    (*((local_120._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import._vptr_Import
      [1])();
  }
LAB_001689e8:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<FuncModuleField>(loc, name);
    Func& func = field->func;
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &local_types,
                                         &func.bindings, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}